

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

string * __thiscall
Color::writeXml(string *__return_storage_ptr__,Color *this,int indent,string *name)

{
  int indent_00;
  ostream *poVar1;
  stringstream str;
  char *local_258;
  long local_250;
  char local_248 [16];
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Util::getIndent_abi_cxx11_(0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_258,local_250);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"R","");
  indent_00 = indent + 1;
  Util::writeXmlElement<float>((stringstream *)local_1b8,indent_00,&local_1d8,this->r);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"G","");
  Util::writeXmlElement<float>((stringstream *)local_1b8,indent_00,&local_1f8,this->g);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"B","");
  Util::writeXmlElement<float>((stringstream *)local_1b8,indent_00,&local_218,this->b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"A","");
  Util::writeXmlElement<float>((stringstream *)local_1b8,indent_00,&local_238,this->a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  Util::getIndent_abi_cxx11_(0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_258,local_250);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Color::writeXml(int indent, std::string name) const
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<" << name << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "R", r);
	Util::writeXmlElement(str, indent + 1, "G", g);
	Util::writeXmlElement(str, indent + 1, "B", b);
	Util::writeXmlElement(str, indent + 1, "A", a);

	str << Util::getIndent(indent) << "</" << name << ">" << std::endl;
	return str.str();
}